

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Sfm_ObjSetupSimInfo(Abc_Obj_t *pObj)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Sfm_Dec_t *p_00;
  word wVar4;
  word *p_01;
  word *local_258;
  word uSim;
  int Indexes [2] [64];
  int local_3c;
  int local_38;
  int i_1;
  int d;
  int c;
  word uValues;
  word uCareSet;
  int i;
  Sfm_Dec_t *p;
  Abc_Obj_t *pObj_local;
  
  p_00 = Sfm_DecMan(pObj);
  p_00->nPats[1] = 0;
  p_00->nPats[0] = 0;
  p_00->nPatWords[1] = 0;
  p_00->nPatWords[0] = 0;
  Vec_WrdFill(p_00->vSets,p_00->nDivs << 3,0);
  Vec_WrdFill(p_00->vSets + 1,p_00->nDivs << 3,0);
  iVar2 = Abc_Bit6WordNum(p_00->nDivs << 2);
  p_00->nDivWords = iVar2;
  if (p_00->nDivWordsAlloc < p_00->nDivWords) {
    iVar2 = Abc_MaxInt(0x10,p_00->nDivWords);
    p_00->nDivWordsAlloc = iVar2;
    for (uCareSet._4_4_ = 0; uCareSet._4_4_ < 8; uCareSet._4_4_ = uCareSet._4_4_ + 1) {
      if (p_00->pDivWords[uCareSet._4_4_] == (word *)0x0) {
        local_258 = (word *)malloc((long)p_00->nDivWordsAlloc << 3);
      }
      else {
        local_258 = (word *)realloc(p_00->pDivWords[uCareSet._4_4_],(long)p_00->nDivWordsAlloc << 3)
        ;
      }
      p_00->pDivWords[uCareSet._4_4_] = local_258;
    }
  }
  memset(p_00->pDivWords[0],0,(long)p_00->nDivWords << 3);
  if ((p_00->pPars->fUseSim != 0) && (p_00->uCareSet != 0)) {
    uVar1 = p_00->uCareSet;
    wVar4 = Sfm_DecObjSim(p_00,pObj);
    if (p_00->iTarget != (pObj->field_6).iTemp) {
      __assert_fail("p->iTarget == pObj->iTemp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                    ,0x195,"void Sfm_ObjSetupSimInfo(Abc_Obj_t *)");
    }
    if (p_00->pPars->fUseSim == 0) {
      __assert_fail("p->pPars->fUseSim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                    ,0x196,"void Sfm_ObjSetupSimInfo(Abc_Obj_t *)");
    }
    for (local_3c = 0; local_3c < 0x40; local_3c = local_3c + 1) {
      if ((uVar1 >> ((byte)local_3c & 0x3f) & 1) != 0) {
        uVar3 = (uint)(((wVar4 >> ((byte)local_3c & 0x3f) & 1) != 0 ^ 0xffU) & 1);
        iVar2 = p_00->nPats[(int)uVar3];
        p_00->nPats[(int)uVar3] = iVar2 + 1;
        Indexes[(long)(int)uVar3 + -1][(long)iVar2 + 0x3e] = local_3c;
      }
    }
    for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
      p_00->nPatWords[i_1] = (p_00->nPats[i_1] >> 6) + 1;
    }
    for (local_38 = 0; local_38 < p_00->nDivs; local_38 = local_38 + 1) {
      iVar2 = Vec_IntEntry(&p_00->vObjMap,local_38);
      wVar4 = Vec_WrdEntry(&p_00->vObjSims,iVar2);
      for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
        for (local_3c = 0; local_3c < p_00->nPats[i_1]; local_3c = local_3c + 1) {
          if ((wVar4 >> ((byte)Indexes[(long)i_1 + -1][(long)local_3c + 0x3e] & 0x3f) & 1) != 0) {
            p_01 = Sfm_DecDivPats(p_00,local_38,i_1);
            Abc_TtSetBit(p_01,local_3c);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void Sfm_ObjSetupSimInfo( Abc_Obj_t * pObj )
{
    Sfm_Dec_t * p = Sfm_DecMan( pObj ); int i;
    p->nPats[0]     = p->nPats[1] = 0;
    p->nPatWords[0] = p->nPatWords[1] = 0;
    Vec_WrdFill( &p->vSets[0], p->nDivs*SFM_SIM_WORDS, 0 );
    Vec_WrdFill( &p->vSets[1], p->nDivs*SFM_SIM_WORDS, 0 );
    // alloc divwords
    p->nDivWords = Abc_Bit6WordNum( 4 * p->nDivs );
    if ( p->nDivWordsAlloc < p->nDivWords )
    {
        p->nDivWordsAlloc = Abc_MaxInt( 16, p->nDivWords );
        for ( i = 0; i < SFM_SUPP_MAX; i++ )
            p->pDivWords[i] = ABC_REALLOC( word, p->pDivWords[i], p->nDivWordsAlloc );
    }
    memset( p->pDivWords[0], 0, sizeof(word) * p->nDivWords );
    // collect simulation info
    if ( p->pPars->fUseSim && p->uCareSet != 0 )
    {
        word uCareSet = p->uCareSet;
        word uValues  = Sfm_DecObjSim(p, pObj);
        int c, d, i, Indexes[2][64];
        assert( p->iTarget == pObj->iTemp );
        assert( p->pPars->fUseSim );
        // find what patterns go to on-set/off-set
        for ( i = 0; i < 64; i++ )
            if ( (uCareSet >> i) & 1 )
            {
                c = !((uValues >> i) & 1);
                Indexes[c][p->nPats[c]++] = i;
            }
        for ( c = 0; c < 2; c++ )
            p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
        // write patterns
        for ( d = 0; d < p->nDivs; d++ )
        {
            word uSim = Vec_WrdEntry( &p->vObjSims, Vec_IntEntry(&p->vObjMap, d) );
            for ( c = 0; c < 2; c++ )
                for ( i = 0; i < p->nPats[c]; i++ )
                    if ( (uSim >> Indexes[c][i]) & 1 )
                        Abc_TtSetBit( Sfm_DecDivPats(p, d, c), i );
        }
        //printf( "Node %d : Onset = %d. Offset = %d.\n", pObj->Id, p->nPats[0], p->nPats[1] );
    }
}